

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool runCommand(Options *options,QString *command)

{
  FILE *__stream;
  undefined1 __stream_00 [8];
  char *pcVar1;
  pointer __old_p;
  long in_FS_OFFSET;
  char buffer [4096];
  undefined1 local_1030 [8];
  QArrayData *local_1028;
  undefined8 *local_1020;
  long local_28;
  
  __stream = _stdout;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    QString::toLocal8Bit_helper((QChar *)&local_1028,(longlong)(command->d).ptr);
    if (local_1020 == (undefined8 *)0x0) {
      local_1020 = &QByteArray::_empty;
    }
    fprintf(__stream,"Running command \'%s\'\n",local_1020);
    if (local_1028 != (QArrayData *)0x0) {
      LOCK();
      (local_1028->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1028->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1028->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1028,1,0x10);
      }
    }
  }
  local_1030 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  openProcess((QString *)local_1030);
  __stream_00 = local_1030;
  if (local_1030 == (undefined1  [8])0x0) {
    runCommand();
  }
  else {
    memset(&local_1028,0xaa,0x1000);
    pcVar1 = fgets((char *)&local_1028,0x1000,(FILE *)__stream_00);
    if (pcVar1 != (char *)0x0) {
      do {
        if (options->verbose == true) {
          fputs((char *)&local_1028,_stdout);
        }
        pcVar1 = fgets((char *)&local_1028,0x1000,(FILE *)__stream_00);
      } while (pcVar1 != (char *)0x0);
    }
    pclose((FILE *)__stream_00);
    fflush(_stdout);
    fflush(_stderr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __stream_00 != (undefined1  [8])0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool runCommand(const Options &options, const QString &command)
{
    if (options.verbose)
        fprintf(stdout, "Running command '%s'\n", qPrintable(command));

    auto runCommand = openProcess(command);
    if (runCommand == nullptr) {
        fprintf(stderr, "Cannot run command '%s'\n", qPrintable(command));
        return false;
    }
    char buffer[4096];
    while (fgets(buffer, sizeof(buffer), runCommand.get()) != nullptr) {
        if (options.verbose)
            fprintf(stdout, "%s", buffer);
    }
    runCommand.reset();
    fflush(stdout);
    fflush(stderr);
    return true;
}